

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarrayblk.c
# Opt level: O2

void tommy_arrayblk_init(tommy_arrayblk *array)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tommy_array_init(&array->block);
  array->count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_arrayblk_init(tommy_arrayblk* array)
{
	tommy_array_init(&array->block);

	array->count = 0;
}